

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O3

uint8_t * chunkmemset_safe_sse2(uint8_t *out,uint8_t *from,uint len,uint left)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong __n;
  uint64_t bytes_remaining;
  uint8_t *cur_chunk;
  undefined4 *__dest;
  undefined1 auVar8 [16];
  chunk_t chunk_load;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  __dest = &local_48;
  __n = (ulong)left;
  if (len < left) {
    __n = (ulong)len;
  }
  uVar7 = (uint)__n;
  if (left < 0x10) {
    if (uVar7 == 0) {
      return out;
    }
    if (left < len) {
      len = left;
    }
    lVar5 = 0;
    do {
      out[lVar5] = from[lVar5];
      lVar5 = lVar5 + 1;
    } while (len != (uint)lVar5);
    return out + lVar5;
  }
  if (len == 0) {
    return out;
  }
  uVar4 = (long)out - (long)from;
  uVar6 = -uVar4;
  if (0 < (long)uVar4) {
    uVar6 = uVar4;
  }
  if (((long)uVar4 < 0) && (uVar6 < __n)) {
    memmove(out,from,__n);
LAB_0013b6ee:
    return out + __n;
  }
  if (uVar6 == 1) {
    memset(out,(uint)*from,__n);
    goto LAB_0013b6ee;
  }
  if (0xf < uVar6) {
    uVar3 = uVar7 - 1 & 0xf;
    uVar2 = *(undefined8 *)(from + 8);
    *(undefined8 *)out = *(undefined8 *)from;
    *(undefined8 *)(out + 8) = uVar2;
    if (~uVar3 + uVar7 != 0) {
      lVar5 = (ulong)uVar3 + 1;
      if (left < len) {
        len = left;
      }
      do {
        uVar2 = *(undefined8 *)(from + lVar5 + 8);
        *(undefined8 *)(out + lVar5) = *(undefined8 *)(from + lVar5);
        *(undefined8 *)(out + lVar5 + 8) = uVar2;
        lVar5 = lVar5 + 0x10;
      } while (len != (uint)lVar5);
      return out + lVar5;
    }
    return out + (ulong)uVar3 + 1;
  }
  if (uVar6 == 8) {
    local_48 = *(undefined4 *)from;
    uStack_44 = *(undefined4 *)(from + 4);
  }
  else if (uVar6 == 4) {
    local_48 = *(undefined4 *)from;
    uStack_44 = local_48;
  }
  else {
    if (uVar6 != 2) {
      uVar4 = 0x10;
      local_38 = uVar6;
      do {
        uVar6 = local_38;
        if (uVar4 < local_38) {
          uVar6 = uVar4;
        }
        memcpy(__dest,from,uVar6);
        __dest = (undefined4 *)((long)__dest + uVar6);
        uVar4 = uVar4 - uVar6;
      } while (uVar4 != 0);
      uVar3 = 0x10 - (int)uVar6;
      goto LAB_0013b7d6;
    }
    auVar8 = pshuflw(ZEXT216(*(ushort *)from),ZEXT216(*(ushort *)from),0);
    local_48 = auVar8._0_4_;
    uStack_44 = local_48;
  }
  uVar3 = 0x10;
  uStack_40 = local_48;
  uStack_3c = uStack_44;
LAB_0013b7d6:
  if (0x1f < uVar7) {
    do {
      *(undefined4 *)out = local_48;
      *(undefined4 *)(out + 4) = uStack_44;
      *(undefined4 *)(out + 8) = uStack_40;
      *(undefined4 *)(out + 0xc) = uStack_3c;
      puVar1 = out + uVar3;
      *(undefined4 *)puVar1 = local_48;
      *(undefined4 *)(puVar1 + 4) = uStack_44;
      *(undefined4 *)(puVar1 + 8) = uStack_40;
      *(undefined4 *)(puVar1 + 0xc) = uStack_3c;
      out = out + uVar3 * 2;
      uVar7 = (int)__n + uVar3 * -2;
      __n = (ulong)uVar7;
    } while (0x1f < uVar7);
  }
  uVar7 = (uint)__n;
  if (0xf < uVar7) {
    do {
      *(ulong *)out = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + 8) = CONCAT44(uStack_3c,uStack_40);
      uVar7 = (int)__n - uVar3;
      __n = (ulong)uVar7;
      out = out + uVar3;
    } while (0xf < uVar7);
  }
  if (uVar7 == 0) {
    return out;
  }
  memcpy(out,&local_48,(ulong)uVar7);
  return out + uVar7;
}

Assistant:

Z_INTERNAL uint8_t* CHUNKMEMSET_SAFE(uint8_t *out, uint8_t *from, unsigned len, unsigned left) {
#if OPTIMAL_CMP < 32
    static const uint32_t align_mask = 7;
#elif OPTIMAL_CMP == 32
    static const uint32_t align_mask = 3;
#endif

    len = MIN(len, left);

#if OPTIMAL_CMP < 64
    while (((uintptr_t)out & align_mask) && (len > 0)) {
        *out++ = *from++;
        --len;
        --left;
    }
#endif

#ifndef HAVE_MASKED_READWRITE
    if (UNLIKELY(left < sizeof(chunk_t))) {
        while (len > 0) {
            *out++ = *from++;
            --len;
        }

        return out;
    }
#endif

    if (len)
        out = CHUNKMEMSET(out, from, len);

    return out;
}